

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O2

void Pdr_ManDeriveResult(Aig_Man_t *pAig,Vec_Int_t *vCiObjs,Vec_Int_t *vCiVals,Vec_Int_t *vCi2Rem,
                        Vec_Int_t *vRes,Vec_Int_t *vPiLits)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Vec_Int_t *p;
  int iVar4;
  
  Aig_ManIncrementTravId(pAig);
  for (iVar4 = 0; iVar4 < vCi2Rem->nSize; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(vCi2Rem,iVar4);
    pAVar3 = Aig_ManObj(pAig,iVar1);
    iVar1 = Saig_ObjIsLo(pAig,pAVar3);
    if (iVar1 == 0) {
      __assert_fail("Saig_ObjIsLo( pAig, pObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim.c"
                    ,0x11a,
                    "void Pdr_ManDeriveResult(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    pAVar3->TravId = pAig->nTravIds;
  }
  vRes->nSize = 0;
  vPiLits->nSize = 0;
  iVar4 = 0;
  do {
    if (vCiObjs->nSize <= iVar4) {
      if (vRes->nSize != 0) {
        return;
      }
      Vec_IntPush(vRes,0);
      return;
    }
    iVar1 = Vec_IntEntry(vCiObjs,iVar4);
    pAVar3 = Aig_ManObj(pAig,iVar1);
    if ((*(uint *)&pAVar3->field_0x18 & 7) == 2) {
      iVar1 = Aig_ObjCioId(pAVar3);
      if (pAig->nTruePis <= iVar1) goto LAB_004df8e3;
      iVar1 = Aig_ObjCioId(pAVar3);
      p = vPiLits;
LAB_004df917:
      iVar2 = Vec_IntEntry(vCiVals,iVar4);
      iVar1 = Abc_Var2Lit(iVar1,(uint)(iVar2 == 0));
      Vec_IntPush(p,iVar1);
    }
    else {
LAB_004df8e3:
      iVar1 = Saig_ObjIsLo(pAig,pAVar3);
      if (iVar1 == 0) {
        __assert_fail("Saig_ObjIsLo(pAig, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim.c"
                      ,0x128,
                      "void Pdr_ManDeriveResult(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (pAVar3->TravId != pAig->nTravIds) {
        iVar1 = Aig_ObjCioId(pAVar3);
        iVar1 = iVar1 - pAig->nTruePis;
        p = vRes;
        goto LAB_004df917;
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void Pdr_ManDeriveResult( Aig_Man_t * pAig, Vec_Int_t * vCiObjs, Vec_Int_t * vCiVals, Vec_Int_t * vCi2Rem, Vec_Int_t * vRes, Vec_Int_t * vPiLits )
{
    Aig_Obj_t * pObj;
    int i, Lit;
    // mark removed flop outputs
    Aig_ManIncrementTravId( pAig );
    Aig_ManForEachObjVec( vCi2Rem, pAig, pObj, i )
    {
        assert( Saig_ObjIsLo( pAig, pObj ) );
        Aig_ObjSetTravIdCurrent(pAig, pObj);
    }
    // collect flop outputs that are not marked
    Vec_IntClear( vRes );
    Vec_IntClear( vPiLits );
    Aig_ManForEachObjVec( vCiObjs, pAig, pObj, i )
    {
        if ( Saig_ObjIsPi(pAig, pObj) )
        {
            Lit = Abc_Var2Lit( Aig_ObjCioId(pObj), (Vec_IntEntry(vCiVals, i) == 0) );
            Vec_IntPush( vPiLits, Lit );
            continue;
        }
        assert( Saig_ObjIsLo(pAig, pObj) );
        if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
            continue;
        Lit = Abc_Var2Lit( Aig_ObjCioId(pObj) - Saig_ManPiNum(pAig), (Vec_IntEntry(vCiVals, i) == 0) );
        Vec_IntPush( vRes, Lit );
    }
    if ( Vec_IntSize(vRes) == 0 )
        Vec_IntPush(vRes, 0);
}